

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O1

int __thiscall ncnn::PriorBox::load_param(PriorBox *this,ParamDict *pd)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  float fVar5;
  Mat local_c8;
  Mat local_78;
  
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,0,&local_78);
  if (&this->min_sizes != &local_c8) {
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->min_sizes).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->min_sizes).data;
        pAVar3 = (this->min_sizes).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->min_sizes).cstep = 0;
    *(undefined8 *)((long)&(this->min_sizes).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->min_sizes).elemsize + 4) = 0;
    (this->min_sizes).data = (void *)0x0;
    (this->min_sizes).refcount = (int *)0x0;
    (this->min_sizes).dims = 0;
    (this->min_sizes).w = 0;
    (this->min_sizes).h = 0;
    (this->min_sizes).d = 0;
    (this->min_sizes).c = 0;
    (this->min_sizes).data = local_c8.data;
    (this->min_sizes).refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->min_sizes).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->min_sizes).elempack = local_c8.elempack;
    (this->min_sizes).allocator = local_c8.allocator;
    (this->min_sizes).dims = local_c8.dims;
    (this->min_sizes).w = local_c8.w;
    (this->min_sizes).h = local_c8.h;
    (this->min_sizes).d = local_c8.d;
    (this->min_sizes).c = local_c8.c;
    (this->min_sizes).cstep = local_c8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,1,&local_78);
  if (&this->max_sizes != &local_c8) {
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->max_sizes).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->max_sizes).data;
        pAVar3 = (this->max_sizes).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->max_sizes).cstep = 0;
    *(undefined8 *)((long)&(this->max_sizes).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->max_sizes).elemsize + 4) = 0;
    (this->max_sizes).data = (void *)0x0;
    (this->max_sizes).refcount = (int *)0x0;
    (this->max_sizes).dims = 0;
    (this->max_sizes).w = 0;
    (this->max_sizes).h = 0;
    (this->max_sizes).d = 0;
    (this->max_sizes).c = 0;
    (this->max_sizes).data = local_c8.data;
    (this->max_sizes).refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->max_sizes).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->max_sizes).elempack = local_c8.elempack;
    (this->max_sizes).allocator = local_c8.allocator;
    (this->max_sizes).dims = local_c8.dims;
    (this->max_sizes).w = local_c8.w;
    (this->max_sizes).h = local_c8.h;
    (this->max_sizes).d = local_c8.d;
    (this->max_sizes).c = local_c8.c;
    (this->max_sizes).cstep = local_c8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,2,&local_78);
  if (&this->aspect_ratios != &local_c8) {
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->aspect_ratios).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->aspect_ratios).data;
        pAVar3 = (this->aspect_ratios).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->aspect_ratios).cstep = 0;
    *(undefined8 *)((long)&(this->aspect_ratios).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->aspect_ratios).elemsize + 4) = 0;
    (this->aspect_ratios).data = (void *)0x0;
    (this->aspect_ratios).refcount = (int *)0x0;
    (this->aspect_ratios).dims = 0;
    (this->aspect_ratios).w = 0;
    (this->aspect_ratios).h = 0;
    (this->aspect_ratios).d = 0;
    (this->aspect_ratios).c = 0;
    (this->aspect_ratios).data = local_c8.data;
    (this->aspect_ratios).refcount =
         (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->aspect_ratios).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
    ;
    (this->aspect_ratios).elempack = local_c8.elempack;
    (this->aspect_ratios).allocator = local_c8.allocator;
    (this->aspect_ratios).dims = local_c8.dims;
    (this->aspect_ratios).w = local_c8.w;
    (this->aspect_ratios).h = local_c8.h;
    (this->aspect_ratios).d = local_c8.d;
    (this->aspect_ratios).c = local_c8.c;
    (this->aspect_ratios).cstep = local_c8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  fVar5 = ParamDict::get(pd,3,0.1);
  this->variances[0] = fVar5;
  fVar5 = ParamDict::get(pd,4,0.1);
  this->variances[1] = fVar5;
  fVar5 = ParamDict::get(pd,5,0.2);
  this->variances[2] = fVar5;
  fVar5 = ParamDict::get(pd,6,0.2);
  this->variances[3] = fVar5;
  iVar4 = ParamDict::get(pd,7,1);
  this->flip = iVar4;
  iVar4 = ParamDict::get(pd,8,0);
  this->clip = iVar4;
  iVar4 = ParamDict::get(pd,9,0);
  this->image_width = iVar4;
  iVar4 = ParamDict::get(pd,10,0);
  this->image_height = iVar4;
  fVar5 = ParamDict::get(pd,0xb,-233.0);
  this->step_width = fVar5;
  fVar5 = ParamDict::get(pd,0xc,-233.0);
  this->step_height = fVar5;
  fVar5 = ParamDict::get(pd,0xd,0.0);
  this->offset = fVar5;
  iVar4 = ParamDict::get(pd,0xe,0);
  this->step_mmdetection = iVar4 != 0;
  iVar4 = ParamDict::get(pd,0xf,0);
  this->center_mmdetection = iVar4 != 0;
  return 0;
}

Assistant:

int PriorBox::load_param(const ParamDict& pd)
{
    min_sizes = pd.get(0, Mat());
    max_sizes = pd.get(1, Mat());
    aspect_ratios = pd.get(2, Mat());
    variances[0] = pd.get(3, 0.1f);
    variances[1] = pd.get(4, 0.1f);
    variances[2] = pd.get(5, 0.2f);
    variances[3] = pd.get(6, 0.2f);
    flip = pd.get(7, 1);
    clip = pd.get(8, 0);
    image_width = pd.get(9, 0);
    image_height = pd.get(10, 0);
    step_width = pd.get(11, -233.f);
    step_height = pd.get(12, -233.f);
    offset = pd.get(13, 0.f);
    step_mmdetection = pd.get(14, 0);
    center_mmdetection = pd.get(15, 0);

    return 0;
}